

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CheckModificationVisitor::doCheck
          (CheckModificationVisitor *this,Node *checkee,Node *n)

{
  TreeOp TVar1;
  Node *lhs;
  BinExpr *in_RDX;
  Node *in_RSI;
  long in_RDI;
  IncExpr *inc;
  BinExpr *bin;
  TreeOp op;
  Node *in_stack_ffffffffffffffa8;
  Node *in_stack_ffffffffffffffb0;
  NodeEqualChecker *in_stack_ffffffffffffffb8;
  undefined1 local_1;
  
  TVar1 = Node::op((Node *)in_RDX);
  if ((TVar1 == TO_ASSIGN) || ((0x2b < (int)TVar1 && ((int)TVar1 < 0x31)))) {
    lhs = (Node *)(in_RDI + 0x18);
    BinExpr::lhs(in_RDX);
    local_1 = NodeEqualChecker::check((NodeEqualChecker *)in_RSI,lhs,in_stack_ffffffffffffffa8);
  }
  else if (TVar1 == TO_INC) {
    IncExpr::argument((IncExpr *)in_RDX);
    local_1 = NodeEqualChecker::check(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RSI);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool doCheck(const Node *checkee, Node *n) const {
    enum TreeOp op = n->op();

    if (op == TO_ASSIGN || (TO_PLUSEQ <= op && op <= TO_MODEQ)) {
      BinExpr *bin = static_cast<BinExpr *>(n);
      return equalChecker.check(checkee, bin->lhs());
    }

    if (op == TO_INC) {
      IncExpr *inc = static_cast<IncExpr *>(n);
      return equalChecker.check(checkee, inc->argument());
    }

    return false;
  }